

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

art_node_t * art_node4_insert(art_node4_t *node,art_node_t *child,uint8_t key)

{
  size_t __n;
  art_node_t in_DL;
  art_node16_t *in_RSI;
  art_node_t *in_RDI;
  size_t i;
  art_node16_t *new_node;
  size_t after;
  size_t idx;
  uint8_t in_stack_ffffffffffffffbf;
  art_key_chunk_t *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffd8;
  ulong uVar1;
  uint8_t key_00;
  undefined7 in_stack_ffffffffffffffe0;
  art_node_t *local_8;
  
  if ((byte)in_RDI[7] < 4) {
    for (uVar1 = 0; (uVar1 < (byte)in_RDI[7] && ((byte)in_RDI[uVar1 + 8] <= (byte)in_DL));
        uVar1 = uVar1 + 1) {
    }
    __n = (byte)in_RDI[7] - uVar1;
    memmove(in_RDI + uVar1 + 9,in_RDI + uVar1 + 8,__n);
    memmove(in_RDI + uVar1 * 8 + 0x18,in_RDI + uVar1 * 8 + 0x10,__n * 8);
    *(art_node16_t **)(in_RDI + uVar1 * 8 + 0x10) = in_RSI;
    in_RDI[uVar1 + 8] = in_DL;
    in_RDI[7] = (art_node_t)((char)in_RDI[7] + '\x01');
    local_8 = in_RDI;
  }
  else {
    art_node16_create(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
    for (uVar1 = 0; key_00 = (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x38), uVar1 < 4;
        uVar1 = uVar1 + 1) {
      art_node16_insert(in_RSI,(art_node_t *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),key_00);
    }
    roaring_free((void *)0x119fed);
    local_8 = art_node16_insert(in_RSI,(art_node_t *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),
                                key_00);
  }
  return local_8;
}

Assistant:

static art_node_t *art_node4_insert(art_node4_t *node, art_node_t *child,
                                    uint8_t key) {
    if (node->count < 4) {
        size_t idx = 0;
        for (; idx < node->count; ++idx) {
            if (node->keys[idx] > key) {
                break;
            }
        }
        size_t after = node->count - idx;
        // Shift other keys to maintain sorted order.
        memmove(node->keys + idx + 1, node->keys + idx,
                after * sizeof(art_key_chunk_t));
        memmove(node->children + idx + 1, node->children + idx,
                after * sizeof(art_node_t *));

        node->children[idx] = child;
        node->keys[idx] = key;
        node->count++;
        return (art_node_t *)node;
    }
    art_node16_t *new_node =
        art_node16_create(node->base.prefix, node->base.prefix_size);
    // Instead of calling insert, this could be specialized to 2x memcpy and
    // setting the count.
    for (size_t i = 0; i < 4; ++i) {
        art_node16_insert(new_node, node->children[i], node->keys[i]);
    }
    roaring_free(node);
    return art_node16_insert(new_node, child, key);
}